

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall
QIconModeViewBase::doDynamicLayout(QIconModeViewBase *this,QListViewLayoutInfo *info)

{
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_00;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_01;
  QListViewPrivate *pQVar1;
  QAbstractItemModel *pQVar2;
  QListViewItem *pQVar3;
  QSize QVar4;
  char cVar5;
  P _a;
  int iVar6;
  int iVar7;
  int iVar8;
  QSize QVar9;
  long lVar10;
  pointer pQVar11;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar12;
  QSize QVar13;
  short sVar14;
  uint uVar15;
  Representation RVar16;
  int iVar17;
  QListViewLayoutInfo *pQVar18;
  Representation RVar19;
  int extraout_EDX;
  int extraout_EDX_00;
  QSize *pQVar20;
  int extraout_var;
  int extraout_var_00;
  QSize *pQVar21;
  QSize *pQVar22;
  int iVar23;
  char *pcVar24;
  uint uVar25;
  uint uVar26;
  Representation RVar27;
  ulong uVar28;
  long lVar29;
  long in_FS_OFFSET;
  bool bVar30;
  bool bVar31;
  Representation RVar32;
  Representation RVar34;
  undefined1 auVar33 [16];
  Bucket BVar35;
  ulong local_c8;
  ulong local_b0;
  QRect local_88;
  QModelIndex local_78;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar22 = (QSize *)&(info->grid).ht;
  bVar31 = -1 < ((info->grid).ht.m_i | (info->grid).wd.m_i);
  QVar9 = (QSize)initDynamicLayout(this,info);
  local_88.y2.m_i = (int)QVar9.ht.m_i;
  if (info->flow == LeftToRight) {
    lVar10 = 8;
    pQVar18 = info;
    pQVar21 = &info->grid;
    QVar13 = (QSize)((ulong)QVar9 >> 0x20);
    QVar4 = QVar9;
  }
  else {
    lVar10 = 0xc;
    pQVar18 = (QListViewLayoutInfo *)&(info->bounds).y1;
    pQVar21 = pQVar22;
    pQVar22 = &info->grid;
    QVar13 = QVar9;
    QVar4 = (QSize)((ulong)QVar9 >> 0x20);
  }
  local_c8 = (ulong)QVar4 & 0xffffffff;
  local_b0 = (ulong)QVar13 & 0xffffffff;
  pQVar20 = (QSize *)&(this->super_QCommonListViewBase).batchSavedDeltaSeg;
  if (bVar31) {
    pQVar20 = pQVar22;
  }
  pcVar24 = (this->moved).d.d.ptr;
  if (pcVar24 == (char *)0x0) {
    pcVar24 = (char *)&QByteArray::_empty;
  }
  uVar25 = info->spacing + (pQVar18->bounds).x1.m_i;
  iVar8 = *(int *)((long)&(info->bounds).x1.m_i + lVar10);
  iVar17 = (pQVar21->wd).m_i;
  iVar23 = (pQVar20->wd).m_i;
  if ((this->moved).d.d.size * 8 - (long)*pcVar24 != (this->items).d.size) {
    QBitArray::resize((longlong)&this->moved);
  }
  local_88.x1.m_i = 0;
  local_88.y1.m_i = 0;
  local_88.x2.m_i = (int)QVar9.wd.m_i;
  iVar6 = info->first;
  iVar7 = info->last;
  if (iVar7 < iVar6) {
    pQVar22 = (QSize *)0x0;
  }
  else {
    uVar28 = (long)iVar6;
    lVar10 = (long)iVar6 * 0x14 + -0x14;
    do {
      lVar29 = lVar10;
      pQVar11 = QList<QListViewItem>::data(&this->items);
      pQVar1 = (this->super_QCommonListViewBase).dd;
      local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = (pQVar1->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)local_58,&(pQVar1->super_QAbstractItemViewPrivate).root);
      (**(code **)(*(long *)pQVar2 + 0x60))(&local_78,pQVar2,uVar28 & 0xffffffff,0);
      auVar33 = (undefined1  [16])local_78._0_16_;
      local_48.ptr = local_78.m.ptr;
      local_58._0_4_ = local_78.r;
      local_58._4_4_ = local_78.c;
      uStack_50 = local_78.i;
      this_00 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  **)(*(long *)((pQVar1->super_QAbstractItemViewPrivate).model + 8) + 0x90);
      local_78._0_16_ = auVar33;
      if (this_00 ==
          (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           *)0x0) {
LAB_00573b0d:
        uVar26 = (uint)local_c8;
        iVar6 = iVar23;
        if (bVar31) {
          iVar7 = (info->grid).wd.m_i;
          sVar14 = *(short *)((long)&pQVar11[1].w + lVar29);
          if (iVar7 < sVar14) {
            sVar14 = (short)iVar7;
          }
          *(short *)((long)&pQVar11[1].w + lVar29) = sVar14;
          iVar7 = (info->grid).ht.m_i;
          sVar14 = *(short *)((long)&pQVar11[1].h + lVar29);
          if (iVar7 < sVar14) {
            sVar14 = (short)iVar7;
          }
          *(short *)((long)&pQVar11[1].h + lVar29) = sVar14;
          uVar15 = uVar25;
          if ((iVar8 < (int)(uVar26 + iVar17) & info->wrap & (int)uVar25 < (int)uVar26) == 0) {
            iVar6 = 0;
            uVar15 = uVar26;
          }
          local_c8 = (ulong)uVar15;
        }
        else {
          bVar30 = info->flow == LeftToRight;
          iVar17 = (int)*(short *)((long)&pQVar11[1].w + lVar29 + (ulong)!bVar30 * 2) +
                   info->spacing;
          if ((iVar8 < (int)(iVar17 + uVar26) & info->wrap & (int)uVar25 < (int)uVar26) == 0) {
            iVar6 = 0;
          }
          else {
            local_c8 = (ulong)uVar25;
            iVar23 = 0;
          }
          iVar7 = info->spacing + (int)*(short *)((long)&pQVar11[1].w + lVar29 + (ulong)bVar30 * 2);
          if (iVar23 <= iVar7) {
            iVar23 = iVar7;
          }
        }
        RVar19.m_i = (int)local_b0 + iVar6;
        local_b0 = (ulong)(uint)RVar19.m_i;
        RVar27.m_i = (int)local_c8;
        if (((byte)(this->moved).d.d.ptr[((long)uVar28 >> 3) + 1] >> ((uint)uVar28 & 7) & 1) == 0) {
          if (info->flow == LeftToRight) {
            if (bVar31) {
              *(int *)((long)&pQVar11[1].x + lVar29) =
                   (iVar17 - *(short *)((long)&pQVar11[1].w + lVar29)) / 2 + RVar27.m_i;
              *(int *)((long)&pQVar11[1].y + lVar29) = RVar19.m_i;
              goto LAB_00573cc7;
            }
            *(int *)((long)&pQVar11[1].x + lVar29) = RVar27.m_i;
            *(int *)((long)&pQVar11[1].y + lVar29) = RVar19.m_i;
            local_c8 = local_b0;
            RVar19.m_i = RVar27.m_i;
          }
          else {
            if (bVar31) {
              *(int *)((long)&pQVar11[1].y + lVar29) =
                   (iVar17 - *(short *)((long)&pQVar11[1].h + lVar29)) / 2 + RVar27.m_i;
              *(int *)((long)&pQVar11[1].x + lVar29) = RVar19.m_i;
              goto LAB_00573c60;
            }
            *(int *)((long)&pQVar11[1].y + lVar29) = RVar27.m_i;
            *(int *)((long)&pQVar11[1].x + lVar29) = RVar19.m_i;
          }
        }
        else {
          if (bVar31) {
            if (info->flow == LeftToRight) {
LAB_00573cc7:
              local_58._4_4_ = RVar19.m_i;
              local_58._0_4_ = RVar27.m_i;
              iVar6 = RVar27.m_i + iVar17;
              iVar7 = RVar19.m_i + iVar23;
            }
            else {
LAB_00573c60:
              local_58._4_4_ = RVar27.m_i;
              local_58._0_4_ = RVar19.m_i;
              iVar6 = RVar19.m_i + iVar23;
              iVar7 = RVar27.m_i + iVar17;
            }
            uStack_50 = CONCAT44(iVar7 + -1,iVar6 + -1);
            local_88._0_8_ = QRect::operator|(&local_88,(QRect *)local_58);
            local_c8 = (ulong)(uint)(RVar27.m_i + iVar17);
            local_88.x2.m_i = extraout_EDX;
            local_88.y2.m_i = extraout_var;
            goto LAB_00573db8;
          }
          local_c8 = (ulong)*(uint *)((long)&pQVar11[1].y + lVar29);
          RVar19.m_i = *(uint *)((long)&pQVar11[1].x + lVar29);
        }
        local_58 = (undefined1  [8])((ulong)(uint)RVar19.m_i | local_c8 << 0x20);
        uStack_50 = CONCAT44((int)*(short *)((long)&pQVar11[1].h + lVar29) + (int)local_c8 + -1,
                             *(short *)((long)&pQVar11[1].w + lVar29) + RVar19.m_i + -1);
        local_88._0_8_ = QRect::operator|(&local_88,(QRect *)local_58);
        local_c8 = (ulong)(uint)(RVar27.m_i + iVar17);
        local_88.x2.m_i = extraout_EDX_00;
        local_88.y2.m_i = extraout_var_00;
      }
      else {
        BVar35 = QHashPrivate::
                 Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                 ::findBucket<QtPrivate::QModelIndexWrapper>(this_00,(QModelIndexWrapper *)local_58)
        ;
        if ((BVar35.span[BVar35.index] == (Span)0xff) || (*(long *)(BVar35.span + 0x80) == 0))
        goto LAB_00573b0d;
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)local_58,&local_78);
        this_01 = (pQVar1->hiddenRows).q_hash.d;
        if (this_01 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)local_58);
          goto LAB_00573b0d;
        }
        pNVar12 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                  findNode<QPersistentModelIndex>(this_01,(QPersistentModelIndex *)local_58);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)local_58);
        if (pNVar12 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) goto LAB_00573b0d;
        *(undefined8 *)((long)&pQVar11[1].x + lVar29) = 0xffffffffffffffff;
        *(undefined4 *)((long)&pQVar11[1].w + lVar29) = 0;
      }
LAB_00573db8:
      iVar7 = info->last;
      bVar30 = (long)uVar28 < (long)iVar7;
      uVar28 = uVar28 + 1;
      lVar10 = lVar29 + 0x14;
    } while (bVar30);
    pQVar22 = (QSize *)((long)&pQVar11[1].x + lVar29);
  }
  (this->super_QCommonListViewBase).batchSavedDeltaSeg = iVar23;
  (this->super_QCommonListViewBase).batchStartRow = iVar7 + 1;
  pQVar1 = (this->super_QCommonListViewBase).dd;
  pQVar2 = (pQVar1->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)local_58,&(pQVar1->super_QAbstractItemViewPrivate).root);
  iVar8 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,(QModelIndex *)local_58);
  if (iVar7 < iVar8 + -1) {
    local_58 = *(undefined1 (*) [8])pQVar22;
    uStack_50 = CONCAT44((int)*(short *)((long)&pQVar22[1].wd.m_i + 2) + (pQVar22->ht).m_i + -1,
                         (int)(short)pQVar22[1].wd.m_i + (pQVar22->wd).m_i + -1);
    cVar5 = QRect::contains(&info->bounds,SUB81(local_58,0));
    if (cVar5 != '\0') {
      RVar32.m_i = (local_88.x2.m_i - local_88.x1.m_i) + 1;
      RVar34.m_i = (local_88.y2.m_i - local_88.y1.m_i) + 1;
      QVar13.ht.m_i = RVar34.m_i;
      QVar13.wd.m_i = RVar32.m_i;
      RVar16.m_i = 0;
      goto LAB_00573ee6;
    }
  }
  RVar32.m_i = (local_88.x2.m_i - local_88.x1.m_i) + 1;
  RVar34.m_i = (local_88.y2.m_i - local_88.y1.m_i) + 1;
  QVar13.ht.m_i = RVar34.m_i;
  QVar13.wd.m_i = RVar32.m_i;
  (this->super_QCommonListViewBase).contentsSize = QVar13;
  if (info->flow == LeftToRight) {
    (this->super_QCommonListViewBase).contentsSize.ht.m_i = RVar34.m_i + info->spacing;
    RVar16.m_i = RVar32.m_i;
  }
  else {
    RVar16.m_i = RVar32.m_i + info->spacing;
    (this->super_QCommonListViewBase).contentsSize.wd.m_i = RVar16.m_i;
  }
LAB_00573ee6:
  auVar33._0_4_ = -(uint)(0 < RVar32.m_i);
  auVar33._4_4_ = -(uint)(0 < RVar32.m_i);
  auVar33._8_4_ = -(uint)(0 < RVar34.m_i);
  auVar33._12_4_ = -(uint)(0 < RVar34.m_i);
  iVar17 = movmskpd(RVar16.m_i,auVar33);
  if (iVar17 == 3) {
    iVar17 = info->first;
    if (iVar17 == 0 || iVar8 + -1 <= iVar7) {
      local_58 = (undefined1  [8])QVar13;
      initBspTree(this,(QSize *)local_58);
      iVar17 = 0;
    }
    if (iVar17 <= info->last) {
      lVar10 = (long)iVar17 * 0x14 + 10;
      uVar28 = (long)iVar17;
      do {
        pQVar3 = (this->items).d.ptr;
        RVar16.m_i = *(int *)((long)pQVar3 + lVar10 + -10);
        RVar32.m_i = *(int *)((long)pQVar3 + lVar10 + -6);
        local_58._4_4_ = RVar32.m_i;
        local_58._0_4_ = RVar16.m_i;
        uStack_50 = CONCAT44(*(short *)((long)&pQVar3->x + lVar10) + RVar32.m_i + -1,
                             *(short *)((long)pQVar3 + lVar10 + -2) + RVar16.m_i + -1);
        QBspTree::climbTree(&this->tree,(QRect *)local_58,QBspTree::insert,
                            (QBspTreeData)(uVar28 & 0xffffffff),0);
        lVar10 = lVar10 + 0x14;
        bVar31 = (long)uVar28 < (long)info->last;
        uVar28 = uVar28 + 1;
      } while (bVar31);
    }
    uStack_50 = CONCAT44(local_88.y2.m_i,local_88.x2.m_i);
    local_58 = (undefined1  [8])QVar9;
    local_78._0_16_ =
         QWidgetPrivate::clipRect((QWidgetPrivate *)(this->super_QCommonListViewBase).dd);
    cVar5 = QRect::intersects((QRect *)&local_78);
    if (cVar5 != '\0') {
      QWidget::update((((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
                      super_QAbstractScrollAreaPrivate.viewport);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIconModeViewBase::doDynamicLayout(const QListViewLayoutInfo &info)
{
    const bool useItemSize = !info.grid.isValid();
    const QPoint topLeft = initDynamicLayout(info);

    int segStartPosition;
    int segEndPosition;
    int deltaFlowPosition;
    int deltaSegPosition;
    int deltaSegHint;
    int flowPosition;
    int segPosition;

    if (info.flow == QListView::LeftToRight) {
        segStartPosition = info.bounds.left() + info.spacing;
        segEndPosition = info.bounds.right();
        deltaFlowPosition = info.grid.width(); // dx
        deltaSegPosition = (useItemSize ? batchSavedDeltaSeg : info.grid.height()); // dy
        deltaSegHint = info.grid.height();
        flowPosition = topLeft.x();
        segPosition = topLeft.y();
    } else { // flow == QListView::TopToBottom
        segStartPosition = info.bounds.top() + info.spacing;
        segEndPosition = info.bounds.bottom();
        deltaFlowPosition = info.grid.height(); // dy
        deltaSegPosition = (useItemSize ? batchSavedDeltaSeg : info.grid.width()); // dx
        deltaSegHint = info.grid.width();
        flowPosition = topLeft.y();
        segPosition = topLeft.x();
    }

    if (moved.size() != items.size())
        moved.resize(items.size());

    QRect rect(QPoint(), topLeft);
    QListViewItem *item = nullptr;
    Q_ASSERT(info.first <= info.last);
    for (int row = info.first; row <= info.last; ++row) {
        item = &items[row];
        if (isHidden(row)) {
            item->invalidate();
        } else {
            // if we are not using a grid, we need to find the deltas
            if (useItemSize) {
                if (info.flow == QListView::LeftToRight)
                    deltaFlowPosition = item->w + info.spacing;
                else
                    deltaFlowPosition = item->h + info.spacing;
            } else {
                item->w = qMin<int>(info.grid.width(), item->w);
                item->h = qMin<int>(info.grid.height(), item->h);
            }

            // create new segment
            if (info.wrap
                && flowPosition + deltaFlowPosition > segEndPosition
                && flowPosition > segStartPosition) {
                flowPosition = segStartPosition;
                segPosition += deltaSegPosition;
                if (useItemSize)
                    deltaSegPosition = 0;
            }
            // We must delay calculation of the seg adjustment, as this item
            // may have caused a wrap to occur
            if (useItemSize) {
                if (info.flow == QListView::LeftToRight)
                    deltaSegHint = item->h + info.spacing;
                else
                    deltaSegHint = item->w + info.spacing;
                deltaSegPosition = qMax(deltaSegPosition, deltaSegHint);
            }

            // set the position of the item
            // ### idealy we should have some sort of alignment hint for the item
            // ### (normally that would be a point between the icon and the text)
            if (!moved.testBit(row)) {
                if (info.flow == QListView::LeftToRight) {
                    if (useItemSize) {
                        item->x = flowPosition;
                        item->y = segPosition;
                    } else { // use grid
                        item->x = flowPosition + ((deltaFlowPosition - item->w) / 2);
                        item->y = segPosition;
                    }
                } else { // TopToBottom
                    if (useItemSize) {
                        item->y = flowPosition;
                        item->x = segPosition;
                    } else { // use grid
                        item->y = flowPosition + ((deltaFlowPosition - item->h) / 2);
                        item->x = segPosition;
                    }
                }
            }

            // let the contents contain the new item
            if (useItemSize)
                rect |= item->rect();
            else if (info.flow == QListView::LeftToRight)
                rect |= QRect(flowPosition, segPosition, deltaFlowPosition, deltaSegPosition);
            else // flow == TopToBottom
                rect |= QRect(segPosition, flowPosition, deltaSegPosition, deltaFlowPosition);

            // prepare for next item
            flowPosition += deltaFlowPosition; // current position + item width + gap
        }
    }
    Q_ASSERT(item);
    batchSavedDeltaSeg = deltaSegPosition;
    batchStartRow = info.last + 1;
    bool done = (info.last >= rowCount() - 1);
    // resize the content area
    if (done || !info.bounds.contains(item->rect())) {
        contentsSize = rect.size();
        if (info.flow == QListView::LeftToRight)
            contentsSize.rheight() += info.spacing;
        else
            contentsSize.rwidth() += info.spacing;
    }
    if (rect.size().isEmpty())
        return;
    // resize tree
    int insertFrom = info.first;
    if (done || info.first == 0) {
        initBspTree(rect.size());
        insertFrom = 0;
    }
    // insert items in tree
    for (int row = insertFrom; row <= info.last; ++row)
        tree.insertLeaf(items.at(row).rect(), row);
    // if the new items are visible, update the viewport
    QRect changedRect(topLeft, rect.bottomRight());
    if (clipRect().intersects(changedRect))
        viewport()->update();
}